

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O0

void TestNextDouble(void)

{
  double value;
  Double d2;
  Double d1;
  Double d0;
  double in_stack_ffffffffffffff98;
  Double in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::NextDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  CheckEqualsHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
                    (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (char *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::NextDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  CheckEqualsHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
                    (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (char *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::NextDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  CheckEqualsHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
                    (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (char *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::NextDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::Sign((Double *)in_stack_ffffffffffffffa0.d64_);
  CheckHelper(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
              (char *)in_stack_ffffffffffffffa0.d64_,
              SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::NextDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::Sign((Double *)in_stack_ffffffffffffffa0.d64_);
  CheckHelper(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
              (char *)in_stack_ffffffffffffffa0.d64_,
              SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::NextDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::NextDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::value((Double *)0x86e9c8);
  CheckEqualsHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
                    (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (char *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::Sign((Double *)in_stack_ffffffffffffffa0.d64_);
  CheckHelper(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
              (char *)in_stack_ffffffffffffffa0.d64_,
              SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
  double_conversion::Double::value((Double *)0x86ea2a);
  CheckEqualsHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
                    (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (char *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::Sign((Double *)in_stack_ffffffffffffffa0.d64_);
  CheckHelper(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
              (char *)in_stack_ffffffffffffffa0.d64_,
              SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
  double_conversion::Double::NextDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  CheckEqualsHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
                    (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (char *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::Infinity();
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  double_conversion::Double::NextDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  CheckEqualsHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
                    (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (char *)in_stack_ffffffffffffffa0.d64_,in_stack_ffffffffffffff98);
  value = double_conversion::Double::Infinity();
  double_conversion::Double::Double((Double *)&stack0xffffffffffffffa0,0x7fefffffffffffff);
  double_conversion::Double::NextDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  CheckEqualsHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
                    (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (char *)in_stack_ffffffffffffffa0.d64_,value);
  return;
}

Assistant:

TEST(NextDouble) {
  CHECK_EQ(4e-324, Double(0.0).NextDouble());
  CHECK_EQ(0.0, Double(-0.0).NextDouble());
  CHECK_EQ(-0.0, Double(-4e-324).NextDouble());
  CHECK(Double(Double(-0.0).NextDouble()).Sign() > 0);
  CHECK(Double(Double(-4e-324).NextDouble()).Sign() < 0);
  Double d0(-4e-324);
  Double d1(d0.NextDouble());
  Double d2(d1.NextDouble());
  CHECK_EQ(-0.0, d1.value());
  CHECK(d1.Sign() < 0);
  CHECK_EQ(0.0, d2.value());
  CHECK(d2.Sign() > 0);
  CHECK_EQ(4e-324, d2.NextDouble());
  CHECK_EQ(-1.7976931348623157e308, Double(-Double::Infinity()).NextDouble());
  CHECK_EQ(Double::Infinity(),
           Double(DOUBLE_CONVERSION_UINT64_2PART_C(0x7fefffff, ffffffff)).NextDouble());
}